

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void declareVariable(void)

{
  Local *pLVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  Compiler *pCVar6;
  Token local_48;
  
  if (current->scopeDepth != 0) {
    iVar2 = current->localCount;
    lVar3 = (long)iVar2;
    pCVar6 = current;
    if (lVar3 < 1) {
      local_48._16_8_ = CONCAT44(parser.previous.line,parser.previous.length);
      local_48._0_8_ = parser.previous._0_8_;
      local_48.start = parser.previous.start;
    }
    else {
      uVar5 = lVar3 + 1;
      uVar4 = lVar3 << 5 | 0x10;
      do {
        iVar2 = *(int *)((long)pCVar6->locals + (uVar4 - 0x18));
        if ((iVar2 != -1) && (iVar2 < pCVar6->scopeDepth)) break;
        if ((parser.previous.length == *(int *)((long)(pCVar6->locals + -1) + uVar4)) &&
           (iVar2 = bcmp(parser.previous.start,*(void **)((long)pCVar6->locals + (uVar4 - 0x28)),
                         (long)parser.previous.length), iVar2 == 0)) {
          errorAt(&parser.previous,"Variable with this name already declared in this scope.");
          pCVar6 = current;
        }
        uVar5 = uVar5 - 1;
        uVar4 = uVar4 - 0x20;
      } while (1 < uVar5);
      iVar2 = pCVar6->localCount;
      local_48._16_8_ = CONCAT44(parser.previous.line,parser.previous.length);
      local_48.type = parser.previous.type;
      local_48._4_4_ = parser.previous._4_4_;
      local_48.start = parser.previous.start;
      if (iVar2 == 0x100) {
        errorAt(&parser.previous,"Too many local variables in function.");
        return;
      }
    }
    parser.previous._0_8_ = local_48._0_8_;
    parser.previous.start = local_48.start;
    pCVar6->localCount = iVar2 + 1;
    pCVar6->locals[iVar2].name.length = local_48.length;
    pCVar6->locals[iVar2].name.line = local_48.line;
    pLVar1 = pCVar6->locals + iVar2;
    (pLVar1->name).type = local_48.type;
    *(undefined4 *)&(pLVar1->name).field_0x4 = local_48._4_4_;
    (pLVar1->name).start = local_48.start;
    pCVar6->locals[iVar2].depth = -1;
    pCVar6->locals[iVar2].isCaptured = false;
  }
  return;
}

Assistant:

static void declareVariable() {
    // Global variables are implicitly declared.
    if (current->scopeDepth == 0) {
        return;
    }

    Token *name = &parser.previous;

    /**
     * Current scope is on the end of array so we looking backwards
     * until we stop on the first element -> the global scope
     */
    for (int i = current->localCount - 1; i >= 0; i--) {
        Local *local = &current->locals[i];
        if (local->depth != -1 && local->depth < current->scopeDepth) {
            break;
        }

        //Check if this variable is declared in same scope twice
        if (identifiersEqual(name, &local->name)) {
            error("Variable with this name already declared in this scope.");
        }
    }
    addLocal(*name);
}